

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.h
# Opt level: O2

simdjson_result<simdjson::dom::element> * __thiscall
simdjson::dom::parser::parse_into_document
          (simdjson_result<simdjson::dom::element> *__return_storage_ptr__,parser *this,
          document *provided_doc,uint8_t *buf,size_t len,bool realloc_if_needed)

{
  unique_ptr<char[],_std::default_delete<char[]>_> *this_00;
  dom_parser_implementation *pdVar1;
  error_code eVar2;
  char *pcVar3;
  
  eVar2 = ensure_capacity(this,provided_doc,len);
  if (eVar2 == SUCCESS) {
    if (realloc_if_needed) {
      this_00 = &this->loaded_bytes;
      pcVar3 = (this->loaded_bytes)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>.
               _M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
               super__Head_base<0UL,_char_*,_false>._M_head_impl;
      if ((pcVar3 == (char *)0x0) || (this->_loaded_bytes_capacity < len)) {
        pcVar3 = internal::allocate_padded_buffer(len);
        std::__uniq_ptr_impl<char,_std::default_delete<char[]>_>::reset
                  ((__uniq_ptr_impl<char,_std::default_delete<char[]>_> *)this_00,pcVar3);
        pcVar3 = (this_00->_M_t).super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                 super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl;
        if (pcVar3 == (char *)0x0) {
          (__return_storage_ptr__->super_simdjson_result_base<simdjson::dom::element>).
          super_pair<simdjson::dom::element,_simdjson::error_code>.first.tape.doc = (document *)0x0;
          (__return_storage_ptr__->super_simdjson_result_base<simdjson::dom::element>).
          super_pair<simdjson::dom::element,_simdjson::error_code>.first.tape.json_index = 0;
          (__return_storage_ptr__->super_simdjson_result_base<simdjson::dom::element>).
          super_pair<simdjson::dom::element,_simdjson::error_code>.second = MEMALLOC;
          return __return_storage_ptr__;
        }
        this->_loaded_bytes_capacity = len;
      }
      memcpy(pcVar3,buf,len);
      buf = (uint8_t *)
            (this_00->_M_t).super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
            super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
            super__Head_base<0UL,_char_*,_false>._M_head_impl;
    }
    pdVar1 = (this->implementation)._M_t.
             super___uniq_ptr_impl<simdjson::internal::dom_parser_implementation,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
             ._M_t.
             super__Tuple_impl<0UL,_simdjson::internal::dom_parser_implementation_*,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
             .super__Head_base<0UL,_simdjson::internal::dom_parser_implementation_*,_false>.
             _M_head_impl;
    eVar2 = (**pdVar1->_vptr_dom_parser_implementation)(pdVar1,buf,len,provided_doc);
    if (eVar2 == SUCCESS) {
      (__return_storage_ptr__->super_simdjson_result_base<simdjson::dom::element>).
      super_pair<simdjson::dom::element,_simdjson::error_code>.first.tape.doc = provided_doc;
      (__return_storage_ptr__->super_simdjson_result_base<simdjson::dom::element>).
      super_pair<simdjson::dom::element,_simdjson::error_code>.first.tape.json_index = 1;
      (__return_storage_ptr__->super_simdjson_result_base<simdjson::dom::element>).
      super_pair<simdjson::dom::element,_simdjson::error_code>.second = SUCCESS;
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->super_simdjson_result_base<simdjson::dom::element>).
  super_pair<simdjson::dom::element,_simdjson::error_code>.first.tape.doc = (document *)0x0;
  (__return_storage_ptr__->super_simdjson_result_base<simdjson::dom::element>).
  super_pair<simdjson::dom::element,_simdjson::error_code>.first.tape.json_index = 0;
  (__return_storage_ptr__->super_simdjson_result_base<simdjson::dom::element>).
  super_pair<simdjson::dom::element,_simdjson::error_code>.second = eVar2;
  return __return_storage_ptr__;
}

Assistant:

inline simdjson_result<element> parser::parse_into_document(document& provided_doc, const uint8_t *buf, size_t len, bool realloc_if_needed) & noexcept {
  // Important: we need to ensure that document has enough capacity.
  // Important: It is possible that provided_doc is actually the internal 'doc' within the parser!!!
  error_code _error = ensure_capacity(provided_doc, len);
  if (_error) { return _error; }
  if (realloc_if_needed) {
    // Make sure we have enough capacity to copy len bytes
    if (!loaded_bytes || _loaded_bytes_capacity < len) {
      loaded_bytes.reset( internal::allocate_padded_buffer(len) );
      if (!loaded_bytes) {
        return MEMALLOC;
      }
      _loaded_bytes_capacity = len;
    }
    std::memcpy(static_cast<void *>(loaded_bytes.get()), buf, len);
  }
  _error = implementation->parse(realloc_if_needed ? reinterpret_cast<const uint8_t*>(loaded_bytes.get()): buf, len, provided_doc);

  if (_error) { return _error; }

  return provided_doc.root();
}